

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

compare_eq_result_container<QList<QUrl>,_QUrl> __thiscall
QList<QUrl>::operator==(QList<QUrl> *this,QList<QUrl> *other)

{
  char cVar1;
  QUrl *pQVar2;
  QUrl *pQVar3;
  long lVar4;
  
  lVar4 = (this->d).size;
  if (lVar4 != (other->d).size) {
    return false;
  }
  pQVar2 = (this->d).ptr;
  pQVar3 = (other->d).ptr;
  cVar1 = '\x01';
  if ((pQVar2 != pQVar3) && (lVar4 != 0)) {
    lVar4 = lVar4 * 8;
    do {
      lVar4 = lVar4 + -8;
      cVar1 = comparesEqual(pQVar2,pQVar3);
      if (cVar1 == '\0') {
        return false;
      }
      pQVar2 = pQVar2 + 1;
      pQVar3 = pQVar3 + 1;
    } while (lVar4 != 0);
  }
  return (compare_eq_result_container<QList<QUrl>,_QUrl>)cVar1;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }